

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void set_gf_interval_range(AV1_COMP *cpi,RATE_CONTROL *rc)

{
  int iVar1;
  long in_RSI;
  AV1_COMP *in_RDI;
  AV1EncoderConfig *oxcf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uVar2;
  AV1EncoderConfig *pAVar3;
  
  pAVar3 = &in_RDI->oxcf;
  iVar1 = has_no_stats_stage(in_RDI);
  if ((iVar1 == 0) || ((pAVar3->rc_cfg).mode != AOM_Q)) {
    *(int *)(in_RSI + 0x24) = (pAVar3->gf_cfg).max_gf_interval;
    *(int *)(in_RSI + 0x20) = (pAVar3->gf_cfg).min_gf_interval;
    if (*(int *)(in_RSI + 0x20) == 0) {
      iVar1 = av1_rc_get_default_min_gf_interval
                        ((int)in_RSI,(int)((ulong)pAVar3 >> 0x20),
                         (double)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      *(int *)(in_RSI + 0x20) = iVar1;
    }
    if (*(int *)(in_RSI + 0x24) == 0) {
      iVar1 = get_default_max_gf_interval(in_RDI->framerate,*(int *)(in_RSI + 0x20));
      *(int *)(in_RSI + 0x24) = iVar1;
    }
    if (in_RDI->ppi->lap_enabled == 0) {
      *(undefined4 *)(in_RSI + 0x28) = 0xfa;
    }
    else {
      *(int *)(in_RSI + 0x28) = *(int *)(in_RSI + 0x24) + 1;
    }
    if (*(int *)(in_RSI + 0x28) < *(int *)(in_RSI + 0x24)) {
      *(undefined4 *)(in_RSI + 0x24) = *(undefined4 *)(in_RSI + 0x28);
    }
    if (*(int *)(in_RSI + 0x20) < *(int *)(in_RSI + 0x24)) {
      uVar2 = *(undefined4 *)(in_RSI + 0x20);
    }
    else {
      uVar2 = *(undefined4 *)(in_RSI + 0x24);
    }
    *(undefined4 *)(in_RSI + 0x20) = uVar2;
  }
  else {
    *(int *)(in_RSI + 0x24) = (pAVar3->gf_cfg).max_gf_interval;
    *(int *)(in_RSI + 0x20) = (pAVar3->gf_cfg).min_gf_interval;
    *(int *)(in_RSI + 0x28) = *(int *)(in_RSI + 0x20) + 1;
  }
  return;
}

Assistant:

static void set_gf_interval_range(const AV1_COMP *const cpi,
                                  RATE_CONTROL *const rc) {
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;

  // Special case code for 1 pass fixed Q mode tests
  if ((has_no_stats_stage(cpi)) && (oxcf->rc_cfg.mode == AOM_Q)) {
    rc->max_gf_interval = oxcf->gf_cfg.max_gf_interval;
    rc->min_gf_interval = oxcf->gf_cfg.min_gf_interval;
    rc->static_scene_max_gf_interval = rc->min_gf_interval + 1;
  } else {
    // Set Maximum gf/arf interval
    rc->max_gf_interval = oxcf->gf_cfg.max_gf_interval;
    rc->min_gf_interval = oxcf->gf_cfg.min_gf_interval;
    if (rc->min_gf_interval == 0)
      rc->min_gf_interval = av1_rc_get_default_min_gf_interval(
          oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height, cpi->framerate);
    if (rc->max_gf_interval == 0)
      rc->max_gf_interval =
          get_default_max_gf_interval(cpi->framerate, rc->min_gf_interval);
    /*
     * Extended max interval for genuinely static scenes like slide shows.
     * The no.of.stats available in the case of LAP is limited,
     * hence setting to max_gf_interval.
     */
    if (cpi->ppi->lap_enabled)
      rc->static_scene_max_gf_interval = rc->max_gf_interval + 1;
    else
      rc->static_scene_max_gf_interval = MAX_STATIC_GF_GROUP_LENGTH;

    if (rc->max_gf_interval > rc->static_scene_max_gf_interval)
      rc->max_gf_interval = rc->static_scene_max_gf_interval;

    // Clamp min to max
    rc->min_gf_interval = AOMMIN(rc->min_gf_interval, rc->max_gf_interval);
  }
}